

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,StringPtr *params)

{
  bool bVar1;
  size_t index;
  StringPtr *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this_00;
  StringPtr *in_R8;
  Maybe<unsigned_long> MVar3;
  size_t local_70;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:1526:22)>
  local_68;
  undefined1 local_48 [8];
  Iterator iter;
  StringPtr *params_local;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)table.ptr;
  iter._16_8_ = in_R8;
  table_local.ptr = params;
  table_local.size_ = (size_t)this;
  searchKey<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr>
            (&local_68,this_00,(ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,in_R8);
  _::BTreeImpl::search((Iterator *)local_48,(BTreeImpl *)(this_00 + 8),&local_68.super_SearchKey);
  bVar1 = _::BTreeImpl::Iterator::isEnd((Iterator *)local_48);
  if (!bVar1) {
    index = _::BTreeImpl::Iterator::operator*((Iterator *)local_48);
    e = ArrayPtr<kj::TreeMap<kj::String,_int>::Entry>::operator[]
                  ((ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,index);
    bVar1 = TreeMap<kj::String,int>::Callbacks::matches<kj::StringPtr&>
                      ((Callbacks *)this_00,e,(StringPtr *)iter._16_8_);
    if (bVar1) {
      local_70 = _::BTreeImpl::Iterator::operator*((Iterator *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_70);
      aVar2 = extraout_RDX;
      goto LAB_001f91f9;
    }
  }
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
  aVar2 = extraout_RDX_00;
LAB_001f91f9:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return nullptr;
    }
  }